

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O1

void __thiscall CVmFormatter::set_charmap(CVmFormatter *this,CCharmapToLocal *cmap)

{
  uint *puVar1;
  CCharmapToLocal *pCVar2;
  
  if (cmap != (CCharmapToLocal *)0x0) {
    puVar1 = &(cmap->super_CCharmap).ref_cnt_;
    *puVar1 = *puVar1 + 1;
  }
  pCVar2 = this->cmap_;
  if (pCVar2 != (CCharmapToLocal *)0x0) {
    puVar1 = &(pCVar2->super_CCharmap).ref_cnt_;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      (*(pCVar2->super_CCharmap)._vptr_CCharmap[1])();
    }
  }
  this->cmap_ = cmap;
  return;
}

Assistant:

void CVmFormatter::set_charmap(CCharmapToLocal *cmap)
{
    /* add a reference to the new mapper, if we have one */
    if (cmap != 0)
        cmap->add_ref();

    /* release our reference on any old mapper */
    if (cmap_ != 0)
        cmap_->release_ref();

    /* remember the new mapper */
    cmap_ = cmap;
}